

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iptables.c
# Opt level: O2

int match_ip(ip_rule_t *ipr,packet_t *pkt)

{
  byte bVar1;
  ip_t *piVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  
  uVar3 = 0;
  uVar4 = 0;
  if (pkt->eth_type == 0x800) {
    piVar2 = pkt->ip;
    bVar1 = ipr->invert;
    uVar4 = uVar3;
    if (((((ipr->smsk).s_addr & piVar2->src) == (ipr->src).s_addr) != (bool)(bVar1 & 1)) &&
       (((bVar1 & 2) == 0) != (((ipr->dmsk).s_addr & piVar2->dst) != (ipr->dst).s_addr))) {
      uVar3 = match_iface(ipr->in,(pkt->iface).in);
      if (uVar3 != ((bVar1 >> 2 & 1) != 0)) {
        uVar3 = match_iface(ipr->out,(pkt->iface).out);
        if ((uVar3 != ((bVar1 >> 3 & 1) != 0)) &&
           ((ipr->proto == '\0' || (((bVar1 & 0x10) == 0) != (pkt->ip_proto != ipr->proto))))) {
          bVar5 = false;
          if ((piVar2->frag & 0xff1f) == 0) {
            bVar5 = ipr->frag != '\0';
          }
          uVar4 = (uint)(bVar5 == ((bVar1 >> 5 & 1) != 0));
        }
      }
    }
  }
  return uVar4;
}

Assistant:

int match_ip(ip_rule_t *ipr, packet_t *pkt)
{
	if (pkt->eth_type != ETH_IP) {
		return 0;
	}

	if (INVF(ipr, INV_SRC, (pkt->ip->src & ipr->smsk.s_addr) != ipr->src.s_addr) ||
		INVF(ipr, INV_DST, (pkt->ip->dst & ipr->dmsk.s_addr) != ipr->dst.s_addr)) {
		return 0;
	}

	if (INVF(ipr, INV_IN, !match_iface(ipr->in, pkt->iface.in))) {
		return 0;
	}

	if (INVF(ipr, INV_OUT, !match_iface(ipr->out, pkt->iface.out))) {
		return 0;
	}

	if (ipr->proto && INVF(ipr, INV_PROTO, pkt->ip_proto != ipr->proto)) {
		return 0;
	}

	if (INVF(ipr, INV_FRAG, !IP_FRAGOFF(pkt->ip) && ipr->frag)) {
		return 0;
	}

	return 1;
}